

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::EnumType_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,EnumDef *enum_def,
          Imports *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumVal *pEVar2;
  pointer pcVar3;
  long lVar4;
  string *psVar5;
  Import *pIVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  pointer ppEVar10;
  ulong uVar11;
  PythonStubGenerator *pPVar12;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_c0;
  string local_a0;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  string *local_40;
  pointer local_38;
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"typing","");
  Imports::Import(imports,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (*(char *)(*(long *)this + 0x3f8) == '\x01') {
    anon_unknown_0::PythonStubGenerator::ModuleForFile
              (&local_a0,(PythonStubGenerator *)this,&(enum_def->super_Definition).file);
  }
  else {
    IdlNamer::NamespacedType_abi_cxx11_
              (&local_a0,(IdlNamer *)(this + 8),&enum_def->super_Definition);
  }
  pPVar12 = this + 8;
  (**(code **)(*(long *)(this + 8) + 0x78))(&local_c0,pPVar12,enum_def);
  pIVar6 = Imports::Import(imports,&local_a0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  local_40 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  ppEVar10 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_38 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar10 != local_38) {
    do {
      pEVar2 = *ppEVar10;
      if (local_a0._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_a0);
      }
      pcVar3 = (pIVar6->name)._M_dataplus._M_p;
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar3,pcVar3 + (pIVar6->name)._M_string_length);
      std::__cxx11::string::append((char *)&local_60);
      (**(code **)(*(long *)pPVar12 + 0x98))(&local_80,pPVar12,pEVar2);
      uVar11 = 0xf;
      if (local_60 != local_50) {
        uVar11 = local_50[0];
      }
      if (uVar11 < (ulong)(local_78 + local_58)) {
        uVar11 = 0xf;
        if (local_80 != local_70) {
          uVar11 = local_70[0];
        }
        if (uVar11 < (ulong)(local_78 + local_58)) goto LAB_00278f2a;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      }
      else {
LAB_00278f2a:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
      }
      psVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_c0.field_2._M_allocated_capacity = *psVar9;
        local_c0.field_2._8_8_ = puVar7[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar9;
        local_c0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_c0._M_string_length = puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)psVar9 = 0;
      std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      ppEVar10 = ppEVar10 + 1;
    } while (ppEVar10 != local_38);
  }
  std::operator+(&local_c0,"typing.Literal[",&local_a0);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c0);
  psVar5 = local_40;
  (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar9) {
    lVar4 = plVar8[3];
    (local_40->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&local_40->field_2 + 8) = lVar4;
  }
  else {
    (local_40->_M_dataplus)._M_p = (pointer)*plVar8;
    (local_40->field_2)._M_allocated_capacity = *psVar9;
  }
  local_40->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return psVar5;
}

Assistant:

std::string EnumType(const EnumDef &enum_def, Imports *imports) const {
    imports->Import("typing");
    const Import &import =
        imports->Import(ModuleFor(&enum_def), namer_.Type(enum_def));

    std::string result = "";
    for (const EnumVal *val : enum_def.Vals()) {
      if (!result.empty()) result += ", ";
      result += import.name + "." + namer_.Variant(*val);
    }
    return "typing.Literal[" + result + "]";
  }